

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

int __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>_>
::CompareError(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>_>
               *this,double x0,double y0,double x1,double y1)

{
  double dVar1;
  uint uVar2;
  double extraout_XMM0_Qa;
  
  (*this->_vptr_BasicPLApproximator[0x1d])();
  dVar1 = this->laPrm_->ubErr;
  uVar2 = 0xffffffff;
  if (dVar1 <= extraout_XMM0_Qa) {
    uVar2 = (uint)(dVar1 < extraout_XMM0_Qa);
  }
  return uVar2;
}

Assistant:

int BasicPLApproximator<FuncCon>::CompareError(
    double x0, double y0, double x1, double y1) {
//  auto err = maxErrorAbs(x0, y0, x1, y1);
  auto err = maxErrorRelAbove1(x0, y0, x1, y1);
  auto ub = laPrm_.ubErr;
  if (err<ub)
    return -1;
  if (err>ub)
    return 1;
  return 0;
}